

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btMultiBodyDynamicsWorld::solveConstraints
          (btMultiBodyDynamicsWorld *this,btContactSolverInfo *solverInfo)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btScalar *pqd;
  ulong uVar3;
  int iVar4;
  btTypedConstraint **ptr;
  btMultiBodyConstraint **ptr_00;
  MultiBodyInplaceSolverIslandCallback *this_00;
  btConstraintSolver *pbVar5;
  btMultiBody *pbVar6;
  btMultibodyLink *pbVar7;
  float *pfVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  btTypedConstraint **ppbVar15;
  long lVar16;
  btMultiBodyConstraint **ppbVar17;
  undefined4 extraout_var;
  float *pfVar18;
  btVector3 *pbVar19;
  btMatrix3x3 *pbVar20;
  btScalar *pbVar21;
  long lVar22;
  btScalar *pbVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  btAlignedObjectArray<float> scratch_r;
  btAlignedObjectArray<btMatrix3x3> scratch_m;
  btAlignedObjectArray<btVector3> scratch_v;
  btAlignedObjectArray<float> delta_q;
  btAlignedObjectArray<float> delta_qd;
  btAlignedObjectArray<float> scratch_r2;
  btAlignedObjectArray<float> local_128;
  float local_104;
  btAlignedObjectArray<btMatrix3x3> local_100;
  btAlignedObjectArray<btVector3> local_e0;
  float local_bc;
  btContactSolverInfo *local_b8;
  btAlignedObjectArray<float> local_b0;
  long local_90;
  btAlignedObjectArray<float> local_88;
  btAlignedObjectArray<float> local_68;
  btScalar *local_48;
  long local_40;
  btScalar *local_38;
  
  local_b8 = solverInfo;
  forwardKinematics(this);
  local_128.m_ownsMemory = true;
  local_128.m_data = (float *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  local_e0.m_ownsMemory = true;
  local_e0.m_data = (btVector3 *)0x0;
  local_e0.m_size = 0;
  local_e0.m_capacity = 0;
  local_100.m_ownsMemory = true;
  local_100.m_data = (btMatrix3x3 *)0x0;
  local_100.m_size = 0;
  local_100.m_capacity = 0;
  CProfileManager::Start_Profile("solveConstraints");
  iVar11 = (this->super_btDiscreteDynamicsWorld).m_constraints.m_size;
  iVar14 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  lVar28 = (long)iVar14;
  if ((iVar14 <= iVar11) && (iVar14 < iVar11)) {
    if ((this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_capacity < iVar11) {
      if (iVar11 == 0) {
        ppbVar15 = (btTypedConstraint **)0x0;
      }
      else {
        ppbVar15 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar11 * 8,0x10);
      }
      lVar16 = (long)(this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
      if (0 < lVar16) {
        lVar22 = 0;
        do {
          ppbVar15[lVar22] =
               (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar16 != lVar22);
      }
      ptr = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data;
      if (ptr != (btTypedConstraint **)0x0) {
        if ((this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data = (btTypedConstraint **)0x0
        ;
      }
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_ownsMemory = true;
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data = ppbVar15;
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_capacity = iVar11;
    }
    if (iVar14 < iVar11) {
      do {
        (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar28] =
             (btTypedConstraint *)0x0;
        lVar28 = lVar28 + 1;
      } while (iVar11 != lVar28);
    }
  }
  (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size = iVar11;
  for (lVar28 = 0;
      iVar11 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
                 _vptr_btCollisionWorld[0x1a])(this), lVar28 < iVar11; lVar28 = lVar28 + 1) {
    (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar28] =
         (this->super_btDiscreteDynamicsWorld).m_constraints.m_data[lVar28];
  }
  iVar11 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  if (1 < iVar11) {
    btAlignedObjectArray<btTypedConstraint_*>::quickSortInternal<btSortConstraintOnIslandPredicate2>
              (&(this->super_btDiscreteDynamicsWorld).m_sortedConstraints,
               (btSortConstraintOnIslandPredicate2 *)&local_68,0,iVar11 + -1);
  }
  iVar11 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             _vptr_btCollisionWorld[0x1a])(this);
  if (iVar11 == 0) {
    ppbVar15 = (btTypedConstraint **)0x0;
  }
  else {
    ppbVar15 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data;
  }
  iVar11 = (this->m_multiBodyConstraints).m_size;
  iVar14 = (this->m_sortedMultiBodyConstraints).m_size;
  lVar28 = (long)iVar14;
  if ((iVar14 <= iVar11) && (iVar14 < iVar11)) {
    if ((this->m_sortedMultiBodyConstraints).m_capacity < iVar11) {
      if (iVar11 == 0) {
        ppbVar17 = (btMultiBodyConstraint **)0x0;
      }
      else {
        ppbVar17 = (btMultiBodyConstraint **)btAlignedAllocInternal((long)iVar11 * 8,0x10);
      }
      lVar16 = (long)(this->m_sortedMultiBodyConstraints).m_size;
      if (0 < lVar16) {
        lVar22 = 0;
        do {
          ppbVar17[lVar22] = (this->m_sortedMultiBodyConstraints).m_data[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar16 != lVar22);
      }
      ptr_00 = (this->m_sortedMultiBodyConstraints).m_data;
      if (ptr_00 != (btMultiBodyConstraint **)0x0) {
        if ((this->m_sortedMultiBodyConstraints).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr_00);
        }
        (this->m_sortedMultiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
      }
      (this->m_sortedMultiBodyConstraints).m_ownsMemory = true;
      (this->m_sortedMultiBodyConstraints).m_data = ppbVar17;
      (this->m_sortedMultiBodyConstraints).m_capacity = iVar11;
    }
    if (iVar14 < iVar11) {
      do {
        (this->m_sortedMultiBodyConstraints).m_data[lVar28] = (btMultiBodyConstraint *)0x0;
        lVar28 = lVar28 + 1;
      } while (iVar11 != lVar28);
    }
  }
  (this->m_sortedMultiBodyConstraints).m_size = iVar11;
  lVar28 = (long)(this->m_multiBodyConstraints).m_size;
  if (0 < lVar28) {
    lVar16 = 0;
    do {
      (this->m_sortedMultiBodyConstraints).m_data[lVar16] =
           (this->m_multiBodyConstraints).m_data[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar28 != lVar16);
  }
  if (1 < iVar11) {
    btAlignedObjectArray<btMultiBodyConstraint_*>::
    quickSortInternal<btSortMultiBodyConstraintOnIslandPredicate>
              (&this->m_sortedMultiBodyConstraints,
               (btSortMultiBodyConstraintOnIslandPredicate *)&local_68,0,iVar11 + -1);
  }
  iVar11 = (this->m_sortedMultiBodyConstraints).m_size;
  ppbVar17 = (this->m_sortedMultiBodyConstraints).m_data;
  this_00 = this->m_solverMultiBodyIslandCallback;
  iVar14 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  iVar12 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             _vptr_btCollisionWorld[5])();
  if (iVar11 == 0) {
    ppbVar17 = (btMultiBodyConstraint **)0x0;
  }
  MultiBodyInplaceSolverIslandCallback::setup
            (this_00,local_b8,ppbVar15,iVar14,ppbVar17,iVar11,
             (btIDebugDraw *)CONCAT44(extraout_var,iVar12));
  pbVar5 = (this->super_btDiscreteDynamicsWorld).m_constraintSolver;
  uVar25 = (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
           m_collisionObjects.m_size;
  uVar13 = (*((this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1)->_vptr_btDispatcher[9])();
  (*pbVar5->_vptr_btConstraintSolver[2])(pbVar5,(ulong)uVar25,(ulong)uVar13);
  btSimulationIslandManager::buildAndProcessIslands
            ((this->super_btDiscreteDynamicsWorld).m_islandManager,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1,(btCollisionWorld *)this,
             &this->m_solverMultiBodyIslandCallback->super_IslandCallback);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  if (0 < (this->m_multiBodies).m_size) {
    lVar28 = 0;
    do {
      pbVar6 = (this->m_multiBodies).m_data[lVar28];
      if (pbVar6->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar29 = false;
      }
      else {
        bVar29 = *(int *)(pbVar6->m_baseCollider + 0xec) == 2;
      }
      iVar11 = (pbVar6->m_links).m_size;
      lVar16 = (long)iVar11;
      if (0 < lVar16) {
        lVar22 = 0;
        bVar10 = bVar29;
        do {
          lVar26 = *(long *)((long)((pbVar6->m_links).m_data)->m_jointTorque + lVar22 + 0x1c);
          if ((lVar26 != 0) && (bVar29 = bVar10, *(int *)(lVar26 + 0xec) == 2)) {
            bVar10 = true;
            bVar29 = true;
          }
          lVar22 = lVar22 + 600;
        } while (lVar16 * 600 - lVar22 != 0);
      }
      if (!bVar29) {
        iVar14 = local_128.m_size;
        lVar22 = (long)local_128.m_size;
        iVar12 = (int)(lVar16 + 1);
        local_40 = lVar28;
        if (local_128.m_size <= iVar12) {
          if ((local_128.m_size <= iVar11) && (local_128.m_capacity <= iVar11)) {
            if (iVar12 == 0) {
              pfVar18 = (float *)0x0;
            }
            else {
              pfVar18 = (float *)btAlignedAllocInternal((lVar16 + 1) * 4,0x10);
            }
            if (0 < (long)local_128.m_size) {
              lVar28 = 0;
              do {
                pfVar18[lVar28] = local_128.m_data[lVar28];
                lVar28 = lVar28 + 1;
              } while (local_128.m_size != lVar28);
            }
            if ((local_128.m_data != (float *)0x0) && (local_128.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_128.m_data);
            }
            local_128.m_ownsMemory = true;
            local_128.m_capacity = iVar12;
            local_128.m_data = pfVar18;
          }
          if (iVar14 <= iVar11) {
            memset(local_128.m_data + lVar22,0,(iVar12 - lVar22) * 4);
          }
        }
        lVar28 = local_40;
        local_128.m_size = iVar12;
        iVar11 = (pbVar6->m_links).m_size;
        lVar16 = (long)iVar11 + 1;
        iVar14 = (int)lVar16;
        if (((local_e0.m_size <= iVar14) && (local_e0.m_size <= iVar11)) &&
           (local_e0.m_capacity <= iVar11)) {
          if (iVar14 == 0) {
            pbVar19 = (btVector3 *)0x0;
          }
          else {
            pbVar19 = (btVector3 *)btAlignedAllocInternal(lVar16 * 0x10,0x10);
          }
          if (0 < (long)local_e0.m_size) {
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar19->m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              lVar22 = lVar22 + 0x10;
            } while ((long)local_e0.m_size * 0x10 != lVar22);
          }
          if ((local_e0.m_data != (btVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_e0.m_data);
          }
          local_e0.m_ownsMemory = true;
          local_e0._4_8_ = lVar16 << 0x20;
          local_e0.m_data = pbVar19;
        }
        local_e0.m_size = iVar14;
        iVar11 = (pbVar6->m_links).m_size;
        lVar16 = (long)iVar11 + 1;
        iVar14 = (int)lVar16;
        if (((local_100.m_size <= iVar14) && (local_100.m_size <= iVar11)) &&
           (local_100.m_capacity <= iVar11)) {
          if (iVar14 == 0) {
            pbVar20 = (btMatrix3x3 *)0x0;
          }
          else {
            pbVar20 = (btMatrix3x3 *)btAlignedAllocInternal(lVar16 * 0x30,0x10);
          }
          if (0 < (long)local_100.m_size) {
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[0].m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar20->m_el[0].m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[1].m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar20->m_el[1].m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              puVar2 = (undefined8 *)((long)(local_100.m_data)->m_el[2].m_floats + lVar22);
              uVar9 = puVar2[1];
              puVar1 = (undefined8 *)((long)pbVar20->m_el[2].m_floats + lVar22);
              *puVar1 = *puVar2;
              puVar1[1] = uVar9;
              lVar22 = lVar22 + 0x30;
            } while ((long)local_100.m_size * 0x30 != lVar22);
          }
          if ((local_100.m_data != (btMatrix3x3 *)0x0) && (local_100.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_100.m_data);
          }
          local_100.m_ownsMemory = true;
          local_100._4_8_ = lVar16 << 0x20;
          local_100.m_data = pbVar20;
        }
        local_100.m_size = iVar14;
        if (pbVar6->m_useRK4 == false) {
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,(local_b8->super_btContactSolverInfoData).m_timeStep,&local_128,
                     &local_e0,&local_100,false);
        }
        else {
          iVar11 = pbVar6->m_dofCount;
          lVar16 = (long)iVar11;
          uVar3 = lVar16 + 6;
          local_90 = (long)pbVar6->m_posVarCnt;
          lVar28 = local_90 + 7;
          local_68.m_ownsMemory = true;
          local_68.m_data = (btScalar *)0x0;
          local_68.m_size = 0;
          local_68.m_capacity = 0;
          iVar14 = (int)uVar3;
          uVar25 = iVar14 * 8 + (int)lVar28 * 2;
          if ((-1 < (int)uVar25) && (uVar25 != 0)) {
            pbVar21 = (btScalar *)btAlignedAllocInternal((ulong)uVar25 * 4,0x10);
            if (0 < (long)local_68.m_size) {
              lVar22 = 0;
              do {
                pbVar21[lVar22] = local_68.m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (local_68.m_size != lVar22);
            }
            if ((local_68.m_data != (btScalar *)0x0) && (local_68.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_68.m_data);
            }
            local_68.m_ownsMemory = true;
            local_68.m_data = pbVar21;
            local_68.m_capacity = uVar25;
            if (uVar25 != 0) {
              memset(pbVar21,0,(ulong)uVar25 << 2);
            }
          }
          pfVar18 = local_68.m_data;
          local_68.m_size = uVar25;
          *local_68.m_data = (pbVar6->m_baseQuat).super_btQuadWord.m_floats[0];
          local_68.m_data[1] = (pbVar6->m_baseQuat).super_btQuadWord.m_floats[1];
          local_68.m_data[2] = (pbVar6->m_baseQuat).super_btQuadWord.m_floats[2];
          local_68.m_data[3] = (pbVar6->m_baseQuat).super_btQuadWord.m_floats[3];
          local_68.m_data[4] = (pbVar6->m_basePos).m_floats[0];
          local_68.m_data[5] = (pbVar6->m_basePos).m_floats[1];
          local_68.m_data[6] = (pbVar6->m_basePos).m_floats[2];
          lVar22 = (long)(pbVar6->m_links).m_size;
          if (0 < lVar22) {
            pbVar7 = (pbVar6->m_links).m_data;
            pbVar21 = pbVar7->m_jointPos;
            lVar26 = 0;
            do {
              iVar12 = pbVar7[lVar26].m_posVarCount;
              if (0 < (long)iVar12) {
                iVar4 = pbVar7[lVar26].m_cfgOffset;
                lVar27 = 0;
                do {
                  local_68.m_data[iVar4 + 7 + (int)lVar27] = pbVar21[lVar27];
                  lVar27 = lVar27 + 1;
                } while (iVar12 != lVar27);
              }
              lVar26 = lVar26 + 1;
              pbVar21 = pbVar21 + 0x96;
            } while (lVar26 != lVar22);
          }
          pbVar21 = local_68.m_data + lVar28;
          local_48 = pbVar21 + lVar28;
          if (-6 < iVar11) {
            pfVar8 = (pbVar6->m_realBuf).m_data;
            uVar24 = 0;
            do {
              local_48[uVar24] = pfVar8[uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          local_104 = (local_b8->super_btContactSolverInfoData).m_timeStep;
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,0.0,&local_128,&local_e0,&local_100,false);
          pqd = local_48 + uVar3;
          pbVar23 = pqd + uVar3;
          if (-6 < iVar11) {
            iVar12 = pbVar6->m_dofCount;
            uVar24 = 0;
            do {
              pbVar23[uVar3 * 2 + uVar24] = local_128.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar6->m_posVarCnt) {
            iVar12 = pbVar6->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar21[uVar24] = pfVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          local_bc = local_104 * 0.5;
          local_38 = pbVar23;
          btMultiBody::stepPositionsMultiDof(pbVar6,local_bc,pbVar21,local_48);
          if (-6 < iVar11) {
            uVar24 = 0;
            do {
              pqd[uVar24] = pbVar23[uVar3 * 2 + uVar24] * local_bc +
                            pfVar18[local_90 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar6->m_dofCount) {
            pfVar8 = (pbVar6->m_realBuf).m_data;
            iVar12 = pbVar6->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar8[uVar24] = pqd[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,0.0,&local_128,&local_e0,&local_100,false);
          if (-6 < iVar11) {
            iVar12 = pbVar6->m_dofCount;
            uVar24 = 0;
            do {
              pbVar23[uVar3 * 3 + uVar24] = local_128.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar6->m_posVarCnt) {
            iVar12 = pbVar6->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar21[uVar24] = pfVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::stepPositionsMultiDof(pbVar6,local_bc,pbVar21,pqd);
          if (-6 < iVar11) {
            uVar24 = 0;
            do {
              pfVar18[local_90 * 2 + lVar16 * 2 + uVar24 + 0x1a] =
                   pbVar23[uVar3 * 3 + uVar24] * local_bc + pfVar18[local_90 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar6->m_dofCount) {
            pfVar8 = (pbVar6->m_realBuf).m_data;
            iVar12 = pbVar6->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar8[uVar24] = pfVar18[local_90 * 2 + lVar16 * 2 + uVar24 + 0x1a];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,0.0,&local_128,&local_e0,&local_100,false);
          if (-6 < iVar11) {
            iVar12 = pbVar6->m_dofCount;
            uVar24 = 0;
            do {
              pbVar23[uVar3 * 4 + uVar24] = local_128.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar6->m_posVarCnt) {
            iVar12 = pbVar6->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar21[uVar24] = pfVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::stepPositionsMultiDof(pbVar6,local_104,pbVar21,local_38);
          if (-6 < iVar11) {
            uVar24 = 0;
            do {
              pbVar23[uVar3 + uVar24] =
                   pbVar23[uVar3 * 4 + uVar24] * local_104 + pfVar18[local_90 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar6->m_dofCount) {
            pfVar18 = (pbVar6->m_realBuf).m_data;
            iVar12 = pbVar6->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar18[uVar24] = pbVar23[uVar3 + uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,0.0,&local_128,&local_e0,&local_100,false);
          if (iVar11 < -5) {
            local_b0.m_ownsMemory = true;
            local_b0.m_data = (float *)0x0;
            local_b0.m_capacity = 0;
LAB_001c9eae:
            local_b0.m_size = iVar14;
            local_88.m_ownsMemory = true;
            local_88.m_data = (btScalar *)0x0;
            local_88.m_size = 0;
            local_88.m_capacity = 0;
            if (-6 < iVar11) {
              pbVar21 = (btScalar *)btAlignedAllocInternal(uVar3 * 4,0x10);
              if (0 < (long)local_88.m_size) {
                lVar28 = 0;
                do {
                  pbVar21[lVar28] = local_88.m_data[lVar28];
                  lVar28 = lVar28 + 1;
                } while (local_88.m_size != lVar28);
              }
              if ((local_88.m_data != (btScalar *)0x0) && (local_88.m_ownsMemory == true)) {
                btAlignedFreeInternal(local_88.m_data);
              }
              local_88.m_ownsMemory = true;
              local_88.m_data = pbVar21;
              local_88.m_capacity = iVar14;
              if (-6 < iVar11) {
                memset(pbVar21,0,lVar16 * 4 + 0x18);
              }
            }
          }
          else {
            iVar12 = pbVar6->m_dofCount;
            uVar24 = 0;
            do {
              pbVar23[uVar3 * 5 + uVar24] = local_128.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
            local_b0.m_ownsMemory = true;
            local_b0.m_data = (float *)0x0;
            local_b0.m_size = 0;
            local_b0.m_capacity = 0;
            if (-6 < iVar11) {
              pfVar18 = (float *)btAlignedAllocInternal(uVar3 * 4,0x10);
              if (0 < (long)local_b0.m_size) {
                lVar28 = 0;
                do {
                  pfVar18[lVar28] = local_b0.m_data[lVar28];
                  lVar28 = lVar28 + 1;
                } while (local_b0.m_size != lVar28);
              }
              if ((local_b0.m_data != (float *)0x0) && (local_b0.m_ownsMemory == true)) {
                btAlignedFreeInternal(local_b0.m_data);
              }
              local_b0.m_ownsMemory = true;
              local_b0.m_data = pfVar18;
              local_b0.m_capacity = iVar14;
              if (-6 < iVar11) {
                memset(pfVar18,0,lVar16 * 4 + 0x18);
                goto LAB_001c9eae;
              }
            }
            local_b0.m_ownsMemory = true;
            local_b0.m_size = iVar14;
            local_88.m_ownsMemory = true;
            local_88.m_data = (btScalar *)0x0;
            local_88.m_capacity = 0;
          }
          local_88.m_size = iVar14;
          if (-6 < iVar11) {
            uVar24 = 0;
            do {
              pfVar18 = local_48 + uVar24;
              local_b0.m_data[uVar24] =
                   (pfVar18[lVar16 * 2 + 0xc] + pfVar18[lVar16 * 2 + 0xc] +
                    pfVar18[lVar16 + 6] + pfVar18[lVar16 + 6] + *pfVar18 +
                   pfVar18[lVar16 * 3 + 0x12]) * (local_104 / 6.0);
              local_88.m_data[uVar24] =
                   (pfVar18[lVar16 * 6 + 0x24] + pfVar18[lVar16 * 6 + 0x24] +
                    pfVar18[lVar16 * 5 + 0x1e] + pfVar18[lVar16 * 5 + 0x1e] +
                    pfVar18[lVar16 * 4 + 0x18] + pfVar18[lVar16 * 7 + 0x2a]) * (local_104 / 6.0);
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar6->m_dofCount) {
            pfVar18 = (pbVar6->m_realBuf).m_data;
            iVar14 = pbVar6->m_dofCount + 5;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            uVar24 = 0;
            do {
              pfVar18[uVar24] = local_48[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar14 + 1 != uVar24);
          }
          btMultiBody::applyDeltaVeeMultiDof(pbVar6,local_88.m_data,1.0);
          if (-6 < iVar11) {
            iVar11 = pbVar6->m_dofCount;
            pfVar18 = (pbVar6->m_realBuf).m_data;
            uVar24 = 0;
            do {
              pfVar18[(long)(iVar11 + iVar11 * iVar11 + 6) + uVar24] = local_b0.m_data[uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar3 & 0xffffffff) != uVar24);
          }
          pbVar6->__posUpdated = true;
          if (0 < (pbVar6->m_links).m_size) {
            lVar28 = 0;
            lVar16 = 0;
            do {
              btMultibodyLink::updateCacheMultiDof
                        ((btMultibodyLink *)
                         ((long)(((pbVar6->m_links).m_data)->m_inertiaLocal).m_floats + lVar28 + -4)
                         ,(btScalar *)0x0);
              lVar16 = lVar16 + 1;
              lVar28 = lVar28 + 600;
            } while (lVar16 < (pbVar6->m_links).m_size);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,0.0,&local_128,&local_e0,&local_100,false);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_b0);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_68);
          lVar28 = local_40;
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < (this->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
    _vptr_btCollisionWorld[0x38])(this);
  MultiBodyInplaceSolverIslandCallback::processConstraints(this->m_solverMultiBodyIslandCallback);
  pbVar5 = (this->super_btDiscreteDynamicsWorld).m_constraintSolver;
  (*pbVar5->_vptr_btConstraintSolver[4])
            (pbVar5,local_b8,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_debugDrawer);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  if (0 < (this->m_multiBodies).m_size) {
    lVar28 = 0;
    do {
      pbVar6 = (this->m_multiBodies).m_data[lVar28];
      if (pbVar6->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar29 = false;
      }
      else {
        bVar29 = *(int *)(pbVar6->m_baseCollider + 0xec) == 2;
      }
      iVar11 = (pbVar6->m_links).m_size;
      lVar16 = (long)iVar11;
      if (0 < lVar16) {
        lVar22 = 0;
        bVar10 = bVar29;
        do {
          lVar26 = *(long *)((long)((pbVar6->m_links).m_data)->m_jointTorque + lVar22 + 0x1c);
          if ((lVar26 != 0) && (bVar29 = bVar10, *(int *)(lVar26 + 0xec) == 2)) {
            bVar10 = true;
            bVar29 = true;
          }
          lVar22 = lVar22 + 600;
        } while (lVar16 * 600 - lVar22 != 0);
      }
      if (!bVar29) {
        iVar14 = local_128.m_size;
        lVar22 = (long)local_128.m_size;
        iVar12 = (int)(lVar16 + 1);
        if (local_128.m_size <= iVar12) {
          if ((local_128.m_size <= iVar11) && (local_128.m_capacity <= iVar11)) {
            if (iVar12 == 0) {
              pfVar18 = (float *)0x0;
            }
            else {
              pfVar18 = (float *)btAlignedAllocInternal((lVar16 + 1) * 4,0x10);
            }
            if (0 < (long)local_128.m_size) {
              lVar16 = 0;
              do {
                pfVar18[lVar16] = local_128.m_data[lVar16];
                lVar16 = lVar16 + 1;
              } while (local_128.m_size != lVar16);
            }
            if ((local_128.m_data != (float *)0x0) && (local_128.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_128.m_data);
            }
            local_128.m_ownsMemory = true;
            local_128.m_capacity = iVar12;
            local_128.m_data = pfVar18;
          }
          if (iVar14 <= iVar11) {
            memset(local_128.m_data + lVar22,0,(iVar12 - lVar22) * 4);
          }
        }
        local_128.m_size = iVar12;
        iVar11 = (pbVar6->m_links).m_size;
        lVar16 = (long)iVar11 + 1;
        iVar14 = (int)lVar16;
        if (((local_e0.m_size <= iVar14) && (local_e0.m_size <= iVar11)) &&
           (local_e0.m_capacity <= iVar11)) {
          if (iVar14 == 0) {
            pbVar19 = (btVector3 *)0x0;
          }
          else {
            pbVar19 = (btVector3 *)btAlignedAllocInternal(lVar16 * 0x10,0x10);
          }
          if (0 < (long)local_e0.m_size) {
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar19->m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              lVar22 = lVar22 + 0x10;
            } while ((long)local_e0.m_size * 0x10 != lVar22);
          }
          if ((local_e0.m_data != (btVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_e0.m_data);
          }
          local_e0.m_ownsMemory = true;
          local_e0._4_8_ = lVar16 << 0x20;
          local_e0.m_data = pbVar19;
        }
        local_e0.m_size = iVar14;
        iVar11 = (pbVar6->m_links).m_size;
        lVar16 = (long)iVar11 + 1;
        iVar14 = (int)lVar16;
        if (((local_100.m_size <= iVar14) && (local_100.m_size <= iVar11)) &&
           (local_100.m_capacity <= iVar11)) {
          if (iVar14 == 0) {
            pbVar20 = (btMatrix3x3 *)0x0;
          }
          else {
            pbVar20 = (btMatrix3x3 *)btAlignedAllocInternal(lVar16 * 0x30,0x10);
          }
          if (0 < (long)local_100.m_size) {
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[0].m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar20->m_el[0].m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[1].m_floats + lVar22);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar20->m_el[1].m_floats + lVar22);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              puVar2 = (undefined8 *)((long)(local_100.m_data)->m_el[2].m_floats + lVar22);
              uVar9 = puVar2[1];
              puVar1 = (undefined8 *)((long)pbVar20->m_el[2].m_floats + lVar22);
              *puVar1 = *puVar2;
              puVar1[1] = uVar9;
              lVar22 = lVar22 + 0x30;
            } while ((long)local_100.m_size * 0x30 != lVar22);
          }
          if ((local_100.m_data != (btMatrix3x3 *)0x0) && (local_100.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_100.m_data);
          }
          local_100.m_ownsMemory = true;
          local_100._4_8_ = lVar16 << 0x20;
          local_100.m_data = pbVar20;
        }
        local_100.m_size = iVar14;
        if (pbVar6->m_useRK4 == false) {
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar6,(local_b8->super_btContactSolverInfoData).m_timeStep,&local_128,
                     &local_e0,&local_100,true);
        }
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < (this->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  if (0 < (this->m_multiBodies).m_size) {
    lVar28 = 0;
    do {
      btMultiBody::processDeltaVeeMultiDof2((this->m_multiBodies).m_data[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 < (this->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  btAlignedObjectArray<btMatrix3x3>::~btAlignedObjectArray(&local_100);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_e0);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_128);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::solveConstraints(btContactSolverInfo& solverInfo)
{
	forwardKinematics();

	btAlignedObjectArray<btScalar> scratch_r;
	btAlignedObjectArray<btVector3> scratch_v;
	btAlignedObjectArray<btMatrix3x3> scratch_m;


	BT_PROFILE("solveConstraints");
	
	m_sortedConstraints.resize( m_constraints.size());
	int i; 
	for (i=0;i<getNumConstraints();i++)
	{
		m_sortedConstraints[i] = m_constraints[i];
	}
	m_sortedConstraints.quickSort(btSortConstraintOnIslandPredicate2());
	btTypedConstraint** constraintsPtr = getNumConstraints() ? &m_sortedConstraints[0] : 0;

	m_sortedMultiBodyConstraints.resize(m_multiBodyConstraints.size());
	for (i=0;i<m_multiBodyConstraints.size();i++)
	{
		m_sortedMultiBodyConstraints[i] = m_multiBodyConstraints[i];
	}
	m_sortedMultiBodyConstraints.quickSort(btSortMultiBodyConstraintOnIslandPredicate());

	btMultiBodyConstraint** sortedMultiBodyConstraints = m_sortedMultiBodyConstraints.size() ?  &m_sortedMultiBodyConstraints[0] : 0;
	

	m_solverMultiBodyIslandCallback->setup(&solverInfo,constraintsPtr,m_sortedConstraints.size(),sortedMultiBodyConstraints,m_sortedMultiBodyConstraints.size(), getDebugDrawer());
	m_constraintSolver->prepareSolve(getCollisionWorld()->getNumCollisionObjects(), getCollisionWorld()->getDispatcher()->getNumManifolds());
	
	/// solve all the constraints for this island
	m_islandManager->buildAndProcessIslands(getCollisionWorld()->getDispatcher(),getCollisionWorld(),m_solverMultiBodyIslandCallback);

#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	{
		BT_PROFILE("btMultiBody addForce");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);

				bod->addBaseForce(m_gravity * bod->getBaseMass());

				for (int j = 0; j < bod->getNumLinks(); ++j) 
				{
					bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
				}
			}//if (!isSleeping)
		}
	}
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	

	{
		BT_PROFILE("btMultiBody stepVelocities");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);
				bool doNotUpdatePos = false;

				{
					if(!bod->isUsingRK4Integration())
					{
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m);
					}
					else
					{						
						//
						int numDofs = bod->getNumDofs() + 6;
						int numPosVars = bod->getNumPosVars() + 7;
						btAlignedObjectArray<btScalar> scratch_r2; scratch_r2.resize(2*numPosVars + 8*numDofs);
						//convenience
						btScalar *pMem = &scratch_r2[0];
						btScalar *scratch_q0 = pMem; pMem += numPosVars;
						btScalar *scratch_qx = pMem; pMem += numPosVars;
						btScalar *scratch_qd0 = pMem; pMem += numDofs;
						btScalar *scratch_qd1 = pMem; pMem += numDofs;
						btScalar *scratch_qd2 = pMem; pMem += numDofs;
						btScalar *scratch_qd3 = pMem; pMem += numDofs;
						btScalar *scratch_qdd0 = pMem; pMem += numDofs;
						btScalar *scratch_qdd1 = pMem; pMem += numDofs;
						btScalar *scratch_qdd2 = pMem; pMem += numDofs;
						btScalar *scratch_qdd3 = pMem; pMem += numDofs;
						btAssert((pMem - (2*numPosVars + 8*numDofs)) == &scratch_r2[0]);

						/////						
						//copy q0 to scratch_q0 and qd0 to scratch_qd0
						scratch_q0[0] = bod->getWorldToBaseRot().x();
						scratch_q0[1] = bod->getWorldToBaseRot().y();
						scratch_q0[2] = bod->getWorldToBaseRot().z();
						scratch_q0[3] = bod->getWorldToBaseRot().w();
						scratch_q0[4] = bod->getBasePos().x();
						scratch_q0[5] = bod->getBasePos().y();
						scratch_q0[6] = bod->getBasePos().z();
						//
						for(int link = 0; link < bod->getNumLinks(); ++link)
						{
							for(int dof = 0; dof < bod->getLink(link).m_posVarCount; ++dof)
								scratch_q0[7 + bod->getLink(link).m_cfgOffset + dof] = bod->getLink(link).m_jointPos[dof];							
						}
						//
						for(int dof = 0; dof < numDofs; ++dof)								
							scratch_qd0[dof] = bod->getVelocityVector()[dof];
						////
						struct
						{
						    btMultiBody *bod;
                            btScalar *scratch_qx, *scratch_q0;

						    void operator()()
						    {
						        for(int dof = 0; dof < bod->getNumPosVars() + 7; ++dof)
                                    scratch_qx[dof] = scratch_q0[dof];
						    }
						} pResetQx = {bod, scratch_qx, scratch_q0};
						//
						struct
						{
						    void operator()(btScalar dt, const btScalar *pDer, const btScalar *pCurVal, btScalar *pVal, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pVal[i] = pCurVal[i] + dt * pDer[i];
						    }

						} pEulerIntegrate;
						//
						struct
                        {
                            void operator()(btMultiBody *pBody, const btScalar *pData)
                            {
                                btScalar *pVel = const_cast<btScalar*>(pBody->getVelocityVector());

                                for(int i = 0; i < pBody->getNumDofs() + 6; ++i)
                                    pVel[i] = pData[i];

                            }
                        } pCopyToVelocityVector;
						//
                        struct
						{
						    void operator()(const btScalar *pSrc, btScalar *pDst, int start, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pDst[i] = pSrc[start + i];
						    }
						} pCopy;
						//

						btScalar h = solverInfo.m_timeStep;
						#define output &scratch_r[bod->getNumDofs()]
						//calc qdd0 from: q0 & qd0	
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd0, 0, numDofs);
						//calc q1 = q0 + h/2 * qd0
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd0);
						//calc qd1 = qd0 + h/2 * qdd0
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd0, scratch_qd0, scratch_qd1, numDofs);
						//
						//calc qdd1 from: q1 & qd1
						pCopyToVelocityVector(bod, scratch_qd1);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd1, 0, numDofs);
						//calc q2 = q0 + h/2 * qd1
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd1);
						//calc qd2 = qd0 + h/2 * qdd1
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd1, scratch_qd0, scratch_qd2, numDofs);
						//
						//calc qdd2 from: q2 & qd2
						pCopyToVelocityVector(bod, scratch_qd2);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd2, 0, numDofs);
						//calc q3 = q0 + h * qd2
						pResetQx();
						bod->stepPositionsMultiDof(h, scratch_qx, scratch_qd2);
						//calc qd3 = qd0 + h * qdd2
						pEulerIntegrate(h, scratch_qdd2, scratch_qd0, scratch_qd3, numDofs);
						//
						//calc qdd3 from: q3 & qd3
						pCopyToVelocityVector(bod, scratch_qd3);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd3, 0, numDofs);

						//
						//calc q = q0 + h/6(qd0 + 2*(qd1 + qd2) + qd3)
						//calc qd = qd0 + h/6(qdd0 + 2*(qdd1 + qdd2) + qdd3)						
						btAlignedObjectArray<btScalar> delta_q; delta_q.resize(numDofs);
						btAlignedObjectArray<btScalar> delta_qd; delta_qd.resize(numDofs);
						for(int i = 0; i < numDofs; ++i)
						{
							delta_q[i] = h/btScalar(6.)*(scratch_qd0[i] + 2*scratch_qd1[i] + 2*scratch_qd2[i] + scratch_qd3[i]);
							delta_qd[i] = h/btScalar(6.)*(scratch_qdd0[i] + 2*scratch_qdd1[i] + 2*scratch_qdd2[i] + scratch_qdd3[i]);							
							//delta_q[i] = h*scratch_qd0[i];
							//delta_qd[i] = h*scratch_qdd0[i];
						}
						//
						pCopyToVelocityVector(bod, scratch_qd0);
						bod->applyDeltaVeeMultiDof(&delta_qd[0], 1);						
						//
						if(!doNotUpdatePos)
						{
							btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
							pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

							for(int i = 0; i < numDofs; ++i)
								pRealBuf[i] = delta_q[i];

							//bod->stepPositionsMultiDof(1, 0, &delta_q[0]);
							bod->setPosUpdated(true);							
						}

						//ugly hack which resets the cached data to t0 (needed for constraint solver)
						{
							for(int link = 0; link < bod->getNumLinks(); ++link)
								bod->getLink(link).updateCacheMultiDof();
							bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0, scratch_r, scratch_v, scratch_m);
						}
						
					}
				}
				
#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
				bod->clearForcesAndTorques();
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
			}//if (!isSleeping)
		}
	}

	clearMultiBodyConstraintForces();

	m_solverMultiBodyIslandCallback->processConstraints();
	
	m_constraintSolver->allSolved(solverInfo, m_debugDrawer);

	{
                BT_PROFILE("btMultiBody stepVelocities");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                                //useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
                                scratch_r.resize(bod->getNumLinks()+1);                 //multidof? ("Y"s use it and it is used to store qdd)
                                scratch_v.resize(bod->getNumLinks()+1);
                                scratch_m.resize(bod->getNumLinks()+1);

                                
                            {
                                if(!bod->isUsingRK4Integration())
                                {
									bool isConstraintPass = true;
                                    bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m, isConstraintPass);
                                }
				}
			}
		}
	}

	for (int i=0;i<this->m_multiBodies.size();i++)
	{
		btMultiBody* bod = m_multiBodies[i];
		bod->processDeltaVeeMultiDof2();
	}

}